

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate1<double>::QRotationGate1
          (QRotationGate1<double> *this,int qubit,rotation_type *rot,bool fixed)

{
  bool fixed_local;
  rotation_type *rot_local;
  int qubit_local;
  QRotationGate1<double> *this_local;
  
  QGate1<double>::QGate1(&this->super_QGate1<double>,qubit);
  QAdjustable::QAdjustable((QAdjustable *)&(this->super_QGate1<double>).field_0xc,fixed);
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016c0c0;
  (this->rotation_).angle_.cos_ = (rot->angle_).cos_;
  (this->rotation_).angle_.sin_ = (rot->angle_).sin_;
  return;
}

Assistant:

QRotationGate1( const int qubit , const rotation_type& rot ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( rot )
        , QAdjustable( fixed )
        { }